

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaVirtualBlock_T::BuildStatsString(VmaVirtualBlock_T *this,bool detailedMap,VmaStringBuilder *sb)

{
  size_t sVar1;
  VmaStringBuilder *pVVar2;
  VmaJsonWriter json;
  VmaDetailedStatistics stats;
  VmaJsonWriter local_98;
  VmaDetailedStatistics local_68;
  
  local_98.m_Stack.m_Allocator.m_pCallbacks = &this->m_AllocationCallbacks;
  if (this->m_AllocationCallbacksSpecified == false) {
    local_98.m_Stack.m_Allocator.m_pCallbacks = (VkAllocationCallbacks *)0x0;
  }
  local_98.m_Stack.m_pArray = (StackItem *)0x0;
  local_98.m_Stack.m_Count._0_1_ = 0;
  local_98.m_Stack.m_Count._1_7_ = 0;
  local_98.m_Stack.m_Capacity._0_1_ = 0;
  local_98._33_8_ = 0;
  local_98.m_SB = sb;
  VmaJsonWriter::BeginObject(&local_98,false);
  local_68.statistics.allocationBytes._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.statistics.blockCount = 0;
  local_68.statistics.allocationCount = 0;
  local_68.statistics.blockBytes._0_4_ = 0;
  local_68.statistics.blockBytes._4_4_ = 0;
  local_68.allocationSizeMin = 0xffffffffffffffff;
  local_68.allocationSizeMax = 0;
  local_68.unusedRangeSizeMin = 0xffffffffffffffff;
  local_68.unusedRangeSizeMax = 0;
  (*this->m_Metadata->_vptr_VmaBlockMetadata[0xe])();
  VmaJsonWriter::BeginString(&local_98,"Stats");
  pVVar2 = local_98.m_SB;
  sVar1 = *(size_t *)((long)local_98.m_SB + 0x10);
  VmaVector<char,_VmaStlAllocator<char>_>::resize(&(local_98.m_SB)->m_Data,sVar1 + 1);
  (*(char **)((long)pVVar2 + 8))[sVar1] = '\"';
  local_98._33_8_ = local_98._33_8_ & 0xffffffffffffff;
  VmaPrintDetailedStatistics(&local_98,&local_68);
  if (detailedMap) {
    VmaJsonWriter::BeginString(&local_98,"Details");
    pVVar2 = local_98.m_SB;
    sVar1 = *(size_t *)((long)local_98.m_SB + 0x10);
    VmaVector<char,_VmaStlAllocator<char>_>::resize(&(local_98.m_SB)->m_Data,sVar1 + 1);
    (*(char **)((long)pVVar2 + 8))[sVar1] = '\"';
    local_98._33_8_ = local_98._33_8_ & 0xffffffffffffff;
    VmaJsonWriter::BeginObject(&local_98,false);
    (*this->m_Metadata->_vptr_VmaBlockMetadata[0x10])(this->m_Metadata,&local_98);
    VmaJsonWriter::EndObject(&local_98);
  }
  VmaJsonWriter::EndObject(&local_98);
  VmaVector<VmaJsonWriter::StackItem,_VmaStlAllocator<VmaJsonWriter::StackItem>_>::~VmaVector
            (&local_98.m_Stack);
  return;
}

Assistant:

void VmaVirtualBlock_T::BuildStatsString(bool detailedMap, VmaStringBuilder& sb) const
{
    VmaJsonWriter json(GetAllocationCallbacks(), sb);
    json.BeginObject();

    VmaDetailedStatistics stats;
    CalculateDetailedStatistics(stats);

    json.WriteString("Stats");
    VmaPrintDetailedStatistics(json, stats);

    if (detailedMap)
    {
        json.WriteString("Details");
        json.BeginObject();
        m_Metadata->PrintDetailedMap(json);
        json.EndObject();
    }

    json.EndObject();
}